

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AddColumn(Parse *pParse,Token *pName,Token *pType)

{
  sqlite3 *db_00;
  Table *pTVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  Column *pCVar5;
  Column *aNew;
  sqlite3 *db;
  Column *pCol;
  char *zType;
  char *z;
  int i;
  Table *p;
  Token *pType_local;
  Token *pName_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  pTVar1 = pParse->pNewTable;
  if (pTVar1 != (Table *)0x0) {
    if (db_00->aLimit[2] < pTVar1->nCol + 1) {
      sqlite3ErrorMsg(pParse,"too many columns on %s",pTVar1->zName);
    }
    else {
      pcVar4 = (char *)sqlite3DbMallocRaw(db_00,(ulong)(pName->n + pType->n + 2));
      if (pcVar4 != (char *)0x0) {
        if (1 < pParse->eParseMode) {
          sqlite3RenameTokenMap(pParse,pcVar4,pName);
        }
        memcpy(pcVar4,pName->z,(ulong)pName->n);
        pcVar4[pName->n] = '\0';
        sqlite3Dequote(pcVar4);
        for (z._4_4_ = 0; z._4_4_ < pTVar1->nCol; z._4_4_ = z._4_4_ + 1) {
          iVar3 = sqlite3_stricmp(pcVar4,pTVar1->aCol[z._4_4_].zName);
          if (iVar3 == 0) {
            sqlite3ErrorMsg(pParse,"duplicate column name: %s",pcVar4);
            sqlite3DbFree(db_00,pcVar4);
            return;
          }
        }
        if ((pTVar1->nCol & 7U) == 0) {
          pCVar5 = (Column *)sqlite3DbRealloc(db_00,pTVar1->aCol,(long)(pTVar1->nCol + 8) << 5);
          if (pCVar5 == (Column *)0x0) {
            sqlite3DbFree(db_00,pcVar4);
            return;
          }
          pTVar1->aCol = pCVar5;
        }
        pCVar5 = pTVar1->aCol + pTVar1->nCol;
        memset(pCVar5,0,0x20);
        pCVar5->zName = pcVar4;
        if (pType->n == 0) {
          pCVar5->affinity = 'A';
          pCVar5->szEst = '\x01';
        }
        else {
          iVar3 = sqlite3Strlen30(pcVar4);
          pcVar4 = pcVar4 + (long)iVar3 + 1;
          memcpy(pcVar4,pType->z,(ulong)pType->n);
          pcVar4[pType->n] = '\0';
          sqlite3Dequote(pcVar4);
          cVar2 = sqlite3AffinityType(pcVar4,pCVar5);
          pCVar5->affinity = cVar2;
          pCVar5->colFlags = pCVar5->colFlags | 4;
        }
        pTVar1->nCol = pTVar1->nCol + 1;
        (pParse->constraintName).n = 0;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddColumn(Parse *pParse, Token *pName, Token *pType){
  Table *p;
  int i;
  char *z;
  char *zType;
  Column *pCol;
  sqlite3 *db = pParse->db;
  if( (p = pParse->pNewTable)==0 ) return;
  if( p->nCol+1>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many columns on %s", p->zName);
    return;
  }
  z = sqlite3DbMallocRaw(db, pName->n + pType->n + 2);
  if( z==0 ) return;
  if( IN_RENAME_OBJECT ) sqlite3RenameTokenMap(pParse, (void*)z, pName);
  memcpy(z, pName->z, pName->n);
  z[pName->n] = 0;
  sqlite3Dequote(z);
  for(i=0; i<p->nCol; i++){
    if( sqlite3_stricmp(z, p->aCol[i].zName)==0 ){
      sqlite3ErrorMsg(pParse, "duplicate column name: %s", z);
      sqlite3DbFree(db, z);
      return;
    }
  }
  if( (p->nCol & 0x7)==0 ){
    Column *aNew;
    aNew = sqlite3DbRealloc(db,p->aCol,(p->nCol+8)*sizeof(p->aCol[0]));
    if( aNew==0 ){
      sqlite3DbFree(db, z);
      return;
    }
    p->aCol = aNew;
  }
  pCol = &p->aCol[p->nCol];
  memset(pCol, 0, sizeof(p->aCol[0]));
  pCol->zName = z;
  sqlite3ColumnPropertiesFromName(p, pCol);
 
  if( pType->n==0 ){
    /* If there is no type specified, columns have the default affinity
    ** 'BLOB' with a default size of 4 bytes. */
    pCol->affinity = SQLITE_AFF_BLOB;
    pCol->szEst = 1;
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( 4>=sqlite3GlobalConfig.szSorterRef ){
      pCol->colFlags |= COLFLAG_SORTERREF;
    }
#endif
  }else{
    zType = z + sqlite3Strlen30(z) + 1;
    memcpy(zType, pType->z, pType->n);
    zType[pType->n] = 0;
    sqlite3Dequote(zType);
    pCol->affinity = sqlite3AffinityType(zType, pCol);
    pCol->colFlags |= COLFLAG_HASTYPE;
  }
  p->nCol++;
  pParse->constraintName.n = 0;
}